

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QWidget * __thiscall QMainWindowLayoutState::centralWidget(QMainWindowLayoutState *this)

{
  long in_RDI;
  QLayoutItem *item;
  undefined8 local_8;
  
  if (*(long **)(in_RDI + 0x138) == (long *)0x0) {
    local_8 = (QWidget *)0x0;
  }
  else {
    local_8 = (QWidget *)(**(code **)(**(long **)(in_RDI + 0x138) + 0x68))();
  }
  return local_8;
}

Assistant:

QWidget *QMainWindowLayoutState::centralWidget() const
{
    QLayoutItem *item = nullptr;

#if QT_CONFIG(dockwidget)
    item = dockAreaLayout.centralWidgetItem;
#else
    item = centralWidgetItem;
#endif

    if (item != nullptr)
        return item->widget();
    return nullptr;
}